

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O3

bool handleGetRequestPDU(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
                        deque<VarBind,_std::allocator<VarBind>_> *varbindList,
                        deque<VarBind,_std::allocator<VarBind>_> *outResponseList,
                        SNMP_VERSION snmpVersion,bool isGetNextRequest)

{
  ValueCallback *callback;
  undefined7 in_register_00000081;
  _Elt_pointer __args;
  _Map_pointer ppVVar1;
  _Elt_pointer pVVar2;
  shared_ptr<BER_CONTAINER> value;
  ValueCallback local_68;
  deque<VarBind,std::allocator<VarBind>> *local_50;
  uint local_48;
  ERROR_STATUS_WITH_VALUE local_44;
  _Elt_pointer local_40;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *local_38;
  
  local_68._20_4_ = SUB84(CONCAT71(in_register_00000081,isGetNextRequest),0);
  __args = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_40 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  if (__args != local_40) {
    pVVar2 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppVVar1 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    local_48 = local_68._20_4_ & 0xff;
    local_50 = (deque<VarBind,std::allocator<VarBind>> *)outResponseList;
    local_38 = callbacks;
    do {
      callback = ValueCallback::findCallback
                           (local_38,(__args->oid).
                                     super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            SUB41(local_48,0),0,(size_t *)0x0);
      if (callback == (ValueCallback *)0x0) {
        if (local_68.isSettable == false) {
          local_68.OID = (SortableOIDType *)operator_new(0x20);
          ((local_68.OID)->super_OIDType).super_BER_CONTAINER._type = 1;
          ((local_68.OID)->super_OIDType).super_BER_CONTAINER._length = 1;
          ((local_68.OID)->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_001a18e8;
          local_68._vptr_ValueCallback = (_func_int **)&((local_68.OID)->super_OIDType).valid;
          *(undefined ***)&((local_68.OID)->super_OIDType).valid = &PTR__BER_CONTAINER_001a10a8;
          ((local_68.OID)->super_OIDType)._value._M_dataplus._M_p = (pointer)0x80;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                    (local_50,__args,(shared_ptr<ImplicitNullType> *)&local_68);
        }
        else {
          local_68.OID = (SortableOIDType *)operator_new(0x20);
          ((local_68.OID)->super_OIDType).super_BER_CONTAINER._type = 1;
          ((local_68.OID)->super_OIDType).super_BER_CONTAINER._length = 1;
          ((local_68.OID)->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_001a18e8;
          local_68._vptr_ValueCallback = (_func_int **)&((local_68.OID)->super_OIDType).valid;
          *(undefined ***)&((local_68.OID)->super_OIDType).valid = &PTR__BER_CONTAINER_001a10a8;
          ((local_68.OID)->super_OIDType)._value._M_dataplus._M_p = (pointer)0x82;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                    (local_50,__args,(shared_ptr<ImplicitNullType> *)&local_68);
        }
      }
      else {
        ValueCallback::getValueForCallback(&local_68,callback);
        if (local_68._vptr_ValueCallback == (_func_int **)0x0) {
          local_44 = GEN_ERR;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    (local_50,&callback->OID,&local_44);
        }
        else {
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                    (local_50,&callback->OID,(shared_ptr<BER_CONTAINER> *)&local_68);
        }
      }
      if (local_68.OID != (SortableOIDType *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.OID);
      }
      __args = __args + 1;
      if (__args == pVVar2) {
        __args = ppVVar1[1];
        ppVVar1 = ppVVar1 + 1;
        pVVar2 = __args + 10;
      }
    } while (__args != local_40);
  }
  return true;
}

Assistant:

bool handleGetRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, SNMP_VERSION snmpVersion, bool isGetNextRequest){
    SNMP_LOGD("handleGetRequestPDU\n");
    for(const VarBind& requestVarBind : varbindList){
        SNMP_LOGD("finding callback for OID: %s\n", requestVarBind.oid->string().c_str());
        ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), isGetNextRequest);
        if(!callback){
            SNMP_LOGD("Couldn't find callback\n");
#if 1
            // According to RFC3416 we should be setting the value to 'noSuchObject' or 'noSuchInstance,
            // but this doesn't seem to render nicely in tools, so possibly revert to old NO_SUCH_NAME error
            if(isGetNextRequest){
                // if it's a walk it's an endOfMibView
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
            } else {
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(NOSUCHOBJECT));
            }

#else
            outResponseList.emplace_back(generateErrorResponse(SNMP_ERROR_VERSION_CTRL_DEF(NOT_WRITABLE, snmpVersion, NO_SUCH_NAME), requestVarBind.oid));
#endif
            continue;
        }

        SNMP_LOGD("Callback found with OID: %s\n", callback->OID->string().c_str());
        //NOTE: we could just use the same pointer as the reqwuest, but delete the value and add a new one. Will have to figure out what to do if it errors, do that later
        auto value = ValueCallback::getValueForCallback(callback);

        if(!value){
            SNMP_LOGD("Couldn't get value for callback\n");
            outResponseList.emplace_back(callback->OID, SNMP_ERROR_VERSION_CTRL(GEN_ERR, snmpVersion));
            continue;   
        }

        outResponseList.emplace_back(callback->OID, value);
    }
    return true; // we didn't fail in our job, even if we filled in nothing
}